

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

ARMCPU_conflict * cpu_arm_init_aarch64(uc_struct_conflict2 *uc)

{
  byte *pbVar1;
  uint64_t *puVar2;
  uc_mode uVar3;
  ARMCPU_conflict *cs;
  GHashTable *pGVar4;
  ARMCPU_conflict *cpu;
  ARMCPU_conflict *uc_00;
  
  cs = (ARMCPU_conflict *)calloc(1,0xd810);
  if (cs != (ARMCPU_conflict *)0x0) {
    (cs->parent_obj).cc = &(cs->cc).parent_class;
    (cs->parent_obj).uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)cs;
    cpu_class_init((uc_struct *)uc,&(cs->cc).parent_class);
    (cs->cc).parent_reset = (_func_void_CPUState_ptr *)(cs->cc).parent_class.reset;
    (cs->cc).parent_class.reset = arm_cpu_reset;
    (cs->cc).parent_class.has_work = arm_cpu_has_work;
    (cs->cc).parent_class.cpu_exec_interrupt = arm_cpu_exec_interrupt_aarch64;
    (cs->cc).parent_class.set_pc = arm_cpu_set_pc;
    (cs->cc).parent_class.synchronize_from_tb = arm_cpu_synchronize_from_tb;
    (cs->cc).parent_class.do_interrupt = arm_cpu_do_interrupt_aarch64;
    (cs->cc).parent_class.get_phys_page_attrs_debug = arm_cpu_get_phys_page_attrs_debug_aarch64;
    (cs->cc).parent_class.asidx_from_attrs = arm_asidx_from_attrs;
    (cs->cc).parent_class.tcg_initialize = arm_translate_init_aarch64;
    (cs->cc).parent_class.tlb_fill_cpu = arm_cpu_tlb_fill_aarch64;
    (cs->cc).parent_class.debug_excp_handler = arm_debug_excp_handler_aarch64;
    (cs->cc).parent_class.do_unaligned_access = arm_cpu_do_unaligned_access_aarch64;
    cpu_common_initfn((uc_struct *)uc,(CPUState *)cs);
    (cs->env).uc = uc;
    (cs->parent_obj).env_ptr = &cs->env;
    (cs->parent_obj).icount_decr_ptr = &(cs->neg).icount_decr;
    pGVar4 = g_hash_table_new_full(g_int_hash,g_int_equal,g_free,cpreg_hashtable_data_destroy);
    cs->cp_regs = pGVar4;
    (cs->pre_el_change_hooks).lh_first = (ARMELChangeHook_conflict *)0x0;
    (cs->el_change_hooks).lh_first = (ARMELChangeHook_conflict *)0x0;
    cs->psci_version = 2;
    uc_00 = cs;
    arm_cpu_post_init_aarch64((CPUState *)cs);
    arm_cpu_realizefn_aarch64((uc_struct_conflict2 *)uc_00,(CPUState *)cs);
    cpu_address_space_init_aarch64((CPUState *)cs,0,(cs->parent_obj).memory);
    qemu_init_vcpu_aarch64((CPUState *)cs);
    uVar3 = uc->mode;
    if (((uVar3 & (UC_MODE_BIG_ENDIAN|UC_MODE_ARMBE8)) != UC_MODE_ARM) &&
       (pbVar1 = (byte *)((long)&(cs->env).uncached_cpsr + 1), *pbVar1 = *pbVar1 | 2,
       (uVar3 >> 0x1e & 1) != 0)) {
      pbVar1 = (byte *)((long)&(cs->env).cp15.field_2 + 8);
      *pbVar1 = *pbVar1 | 0x80;
    }
    puVar2 = &(cs->env).cp15.scr_el3;
    *(byte *)puVar2 = (byte)*puVar2 | 1;
    arm_rebuild_hflags_aarch64(&cs->env);
  }
  return cs;
}

Assistant:

ARMCPU *cpu_arm_init(struct uc_struct *uc)
{
    ARMCPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    CPUARMState *env;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

#if !defined(TARGET_AARCH64)
    if (uc->mode & UC_MODE_MCLASS) {
        uc->cpu_model = UC_CPU_ARM_CORTEX_M33;
    } else if (uc->mode & UC_MODE_ARM926) {
        uc->cpu_model = UC_CPU_ARM_926;
    } else if (uc->mode & UC_MODE_ARM946) {
        uc->cpu_model = UC_CPU_ARM_946;
    } else if (uc->mode & UC_MODE_ARM1176) {
        uc->cpu_model = UC_CPU_ARM_1176;
    } else if (uc->cpu_model == INT_MAX) {
        if (uc->mode & UC_MODE_BIG_ENDIAN) {
            uc->cpu_model = UC_CPU_ARM_1176; // For BE32 mode.
        } else {
            uc->cpu_model = UC_CPU_ARM_CORTEX_A15; // cortex-a15
        }
    } else if (uc->cpu_model >= ARR_SIZE(arm_cpus)) {
        free(cpu);
        return NULL;
    }
#endif

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init ARMCPUClass */
    arm_cpu_class_init(uc, cc);

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init ARMCPU */
    arm_cpu_initfn(uc, cs);

#if !defined(TARGET_AARCH64)
    /* init ARM types */
    if (arm_cpus[uc->cpu_model].class_init) {
        arm_cpus[uc->cpu_model].class_init(uc, cc, uc);
    }
    if (arm_cpus[uc->cpu_model].initfn) {
        arm_cpus[uc->cpu_model].initfn(uc, cs);
    }
#endif

    /* postinit ARMCPU */
    arm_cpu_instance_init(cs);

    /* realize ARMCPU */
    arm_cpu_realizefn(uc, cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    // UC_MODE_BIG_ENDIAN means big endian code and big endian data (BE32), which 
    // is only supported before ARMv7-A (and it only makes sense in qemu usermode!).
    //
    // UC_MODE_ARMBE8 & BE32 difference shouldn't exist in fact. We do this for
    // backward compatibility.
    //
    // UC_MODE_ARMBE8 -> little endian code, big endian data
    // UC_MODE_ARMBE8 | UC_MODE_BIG_ENDIAN -> big endian code, big endian data
    //
    // In QEMU system, all arm instruction fetch **should be** little endian, however
    // we hack it to support (usermode) BE32.
    //
    // Reference:
    // https://developer.arm.com/documentation/ddi0406/c/Application-Level-Architecture/Application-Level-Memory-Model/Endian-support/Instruction-endianness?lang=en
    // https://developer.arm.com/documentation/den0024/a/ARMv8-Registers/Endianness
    env = &cpu->env;
    if (uc->mode & UC_MODE_ARMBE8 || uc->mode & UC_MODE_BIG_ENDIAN) {
        // Big endian data access.
        env->uncached_cpsr |= CPSR_E;
    }

    if (uc->mode & UC_MODE_BIG_ENDIAN) {
        // Big endian code access.
        env->cp15.sctlr_ns |= SCTLR_B;
    }

    // Backward compatiblity, start arm CPU in non-secure state.
    env->cp15.scr_el3 |= SCR_NS;

    arm_rebuild_hflags(env);

    return cpu;
}